

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.hpp
# Opt level: O0

task_priority __thiscall
oqpi::scheduler<concurrent_queue>::resolveTaskPriority
          (scheduler<concurrent_queue> *this,task_handle *hTask)

{
  bool bVar1;
  __shared_ptr<oqpi::task_group_base,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  uint64_t uVar3;
  element_type *local_28;
  element_type *pParentGroup;
  task_priority priority;
  task_handle *hTask_local;
  scheduler<concurrent_queue> *this_local;
  
  pParentGroup._7_1_ = task_handle::getPriority(hTask);
  if (pParentGroup._7_1_ == inherit) {
    p_Var2 = &task_handle::getParentGroup(hTask)->
              super___shared_ptr<oqpi::task_group_base,_(__gnu_cxx::_Lock_policy)2>;
    local_28 = std::__shared_ptr<oqpi::task_group_base,_(__gnu_cxx::_Lock_policy)2>::get(p_Var2);
    do {
      if (local_28 == (element_type *)0x0) {
        uVar3 = task_handle::getUID(hTask);
        bVar1 = assert_and_return_true
                          ("/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/scheduling/scheduler.hpp"
                           ,0xd6,"pParentGroup != nullptr",
                           "One parent group is invalid for this task: %d",uVar3);
        if (bVar1) {
          return normal;
        }
      }
      pParentGroup._7_1_ = task_base::getPriority(&local_28->super_task_base);
      p_Var2 = &task_base::getParentGroup(&local_28->super_task_base)->
                super___shared_ptr<oqpi::task_group_base,_(__gnu_cxx::_Lock_policy)2>;
      local_28 = std::__shared_ptr<oqpi::task_group_base,_(__gnu_cxx::_Lock_policy)2>::get(p_Var2);
    } while (pParentGroup._7_1_ == inherit);
  }
  return pParentGroup._7_1_;
}

Assistant:

task_priority resolveTaskPriority(const task_handle &hTask)
        {
            task_priority priority = hTask.getPriority();

            if (priority == task_priority::inherit)
            {
                auto pParentGroup = hTask.getParentGroup().get();
                do 
                {
                    if (oqpi_failedf(pParentGroup != nullptr, "One parent group is invalid for this task: %d", hTask.getUID()))
                    {
                         priority = task_priority::normal;
                        break;
                    }

                    priority     = pParentGroup->getPriority();
                    pParentGroup = pParentGroup->getParentGroup().get();

                } while (priority == task_priority::inherit);
            }

            return priority;
        }